

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O1

void Saig_StrSimulateNode(Aig_Obj_t *pObj,int i)

{
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *pAVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  
  pAVar1 = pObj->pFanin0;
  pAVar2 = pObj->pFanin1;
  lVar3 = *(long *)(((ulong)pAVar1 & 0xfffffffffffffffe) + 0x28);
  lVar4 = *(long *)(((ulong)pAVar2 & 0xfffffffffffffffe) + 0x28);
  if (((uint)pAVar2 & (uint)pAVar1 & 1) == 0) {
    if (((ulong)pAVar2 & 1) == 0 && ((ulong)pAVar1 & 1) != 0) {
      uVar5 = ~*(uint *)(lVar3 + (long)i * 4) & *(uint *)(lVar4 + (long)i * 4);
    }
    else {
      uVar5 = *(uint *)(lVar4 + (long)i * 4);
      if (((ulong)pAVar2 & 1) != 0 && ((ulong)pAVar1 & 1) == 0) {
        uVar5 = ~uVar5;
      }
      uVar5 = *(uint *)(lVar3 + (long)i * 4) & uVar5;
    }
  }
  else {
    uVar5 = ~(*(uint *)(lVar4 + (long)i * 4) | *(uint *)(lVar3 + (long)i * 4));
  }
  *(uint *)((long)(pObj->field_5).pData + (long)i * 4) = uVar5;
  return;
}

Assistant:

void Saig_StrSimulateNode( Aig_Obj_t * pObj, int i )
{
    unsigned * pSims  = (unsigned *)pObj->pData;
    unsigned * pSims0 = (unsigned *)Aig_ObjFanin0(pObj)->pData;
    unsigned * pSims1 = (unsigned *)Aig_ObjFanin1(pObj)->pData;
    if ( Aig_ObjFaninC0(pObj) && Aig_ObjFaninC1(pObj) )
        pSims[i] = ~(pSims0[i] | pSims1[i]);
    else if ( Aig_ObjFaninC0(pObj) && !Aig_ObjFaninC1(pObj) )
        pSims[i] = (~pSims0[i] & pSims1[i]);
    else if ( !Aig_ObjFaninC0(pObj) && Aig_ObjFaninC1(pObj) )
        pSims[i] = (pSims0[i] & ~pSims1[i]);
    else // if ( !Aig_ObjFaninC0(pObj) && !Aig_ObjFaninC1(pObj) )
        pSims[i] = (pSims0[i] & pSims1[i]);
}